

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Superposition.cpp
# Opt level: O0

bool Inferences::Superposition::checkSuperpositionFromVariable
               (Clause *eqClause,Literal *eqLit,TermList eqLHS)

{
  Term *this;
  TermList trm;
  bool bVar1;
  uint uVar2;
  Literal **ppLVar3;
  TermList *pTVar4;
  TermList in_RDX;
  Term *in_RSI;
  Clause *in_RDI;
  TermList arg;
  uint aIdx;
  Literal *lit;
  uint i;
  uint clen;
  TermList in_stack_ffffffffffffffb0;
  Term *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint local_28;
  
  uVar2 = Kernel::Clause::length(in_RDI);
  local_28 = 0;
  do {
    if (uVar2 <= local_28) {
      return true;
    }
    ppLVar3 = Kernel::Clause::operator[](in_RDI,local_28);
    this = &(*ppLVar3)->super_Term;
    if (this != in_RSI) {
      bVar1 = Kernel::Literal::isEquality((Literal *)0x831748);
      if (bVar1) {
        for (in_stack_ffffffffffffffcc = 0; in_stack_ffffffffffffffcc < 2;
            in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
          pTVar4 = Kernel::Term::nthArgument(this,in_stack_ffffffffffffffcc);
          in_stack_ffffffffffffffc0 = (Term *)pTVar4->_content;
          bVar1 = Kernel::TermList::isTerm((TermList *)0x83177d);
          if ((bVar1) &&
             (bVar1 = Kernel::TermList::containsSubterm
                                ((TermList *)in_stack_ffffffffffffffb0._content,in_RDX), bVar1)) {
            return false;
          }
        }
      }
      else {
        trm._content._4_4_ = in_stack_ffffffffffffffcc;
        trm._content._0_4_ = in_stack_ffffffffffffffc8;
        in_stack_ffffffffffffffb0._content = in_RDX._content;
        bVar1 = Kernel::Term::containsSubterm(in_stack_ffffffffffffffc0,trm);
        if (bVar1) {
          return false;
        }
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool Superposition::checkSuperpositionFromVariable(Clause* eqClause, Literal* eqLit, TermList eqLHS)
{
  ASS(eqLHS.isVar());
  //if we should do rewriting, LHS cannot appear inside RHS
  //ASS_REP(!EqHelper::getOtherEqualitySide(eqLit, eqLHS).containsSubterm(eqLHS), eqLit->toString());

  unsigned clen = eqClause->length();
  for(unsigned i=0; i<clen; i++) {
    Literal* lit = (*eqClause)[i];
    if(lit==eqLit) {
      continue;
    }
    if(lit->isEquality()) {
      for(unsigned aIdx=0; aIdx<2; aIdx++) {
	TermList arg = *lit->nthArgument(aIdx);
	if(arg.isTerm() && arg.containsSubterm(eqLHS)) {
	  return false;
	}
      }
    }
    else if(lit->containsSubterm(eqLHS)) {
      return false;
    }
  }

  return true;
}